

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O3

void __thiscall tt::Logger::~Logger(Logger *this)

{
  Buffer *logline;
  char **ppcVar1;
  size_t __n;
  pointer pcVar2;
  int iVar3;
  LogStream *pLVar4;
  char **ppcVar5;
  char *pcVar6;
  int iVar7;
  
  ppcVar1 = &(this->m_impl).m_stream.m_buffer.m_cur;
  pcVar6 = (this->m_impl).m_stream.m_buffer.m_cur;
  iVar7 = (int)ppcVar1;
  iVar3 = iVar7 - (int)pcVar6;
  if (2 < iVar3) {
    pcVar6[0] = '-';
    pcVar6[1] = '-';
    pcVar6 = *ppcVar1 + 2;
    *ppcVar1 = pcVar6;
    iVar3 = iVar7 - (int)pcVar6;
  }
  __n = (this->m_impl).m_basename._M_string_length;
  if ((int)__n < iVar3) {
    memcpy(pcVar6,(this->m_impl).m_basename._M_dataplus._M_p,__n);
    pcVar6 = (this->m_impl).m_stream.m_buffer.m_cur + __n;
    (this->m_impl).m_stream.m_buffer.m_cur = pcVar6;
    iVar3 = iVar7 - (int)pcVar6;
  }
  if (3 < iVar3) {
    pcVar6[2] = ' ';
    pcVar6[0] = ' ';
    pcVar6[1] = ':';
    *ppcVar1 = *ppcVar1 + 3;
  }
  pLVar4 = LogStream::operator<<((LogStream *)this,(this->m_impl).m_line);
  ppcVar5 = &(pLVar4->m_buffer).m_cur;
  pcVar6 = (pLVar4->m_buffer).m_cur;
  if (1 < (int)ppcVar5 - (int)pcVar6) {
    *pcVar6 = '\n';
    *ppcVar5 = *ppcVar5 + 1;
  }
  pcVar6 = *ppcVar1;
  pthread_once(&once_control_,once_init);
  logline = &(this->m_impl).m_stream.m_buffer;
  AsyncLogging::append(AsyncLogger_,logline->m_data,(int)pcVar6 - (int)logline);
  pcVar2 = (this->m_impl).m_basename._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_impl).m_basename.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

Logger::~Logger(){
	
	m_impl.m_stream << "--" << m_impl.m_basename << " : " 
		<< m_impl.m_line << "\n";
	
	const LogStream::Buffer& buf(stream().buffer());

	output(buf.data(), buf.length());
}